

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu540c.c
# Opt level: O0

void vepu540c_h265_set_ref_regs(H265eSyntax_new *syn,hevc_vepu540c_base *regs)

{
  hevc_vepu540c_base *regs_local;
  H265eSyntax_new *syn_local;
  
  regs->reg0242_synt_refm0 =
       (anon_struct_4_6_8604c8ff_for_reg0242_synt_refm0)
       ((uint)regs->reg0242_synt_refm0 & 0xfffffffe | (syn->sp).field_0.CodingSliceFlags >> 0x15 & 1
       );
  regs->reg0242_synt_refm0 =
       (anon_struct_4_6_8604c8ff_for_reg0242_synt_refm0)
       ((uint)regs->reg0242_synt_refm0 & 0xfffe0001 | (uint)(syn->sp).poc_lsb_lt0 << 1);
  regs->reg0242_synt_refm0 =
       (anon_struct_4_6_8604c8ff_for_reg0242_synt_refm0)
       ((uint)regs->reg0242_synt_refm0 & 0xff3fffff | ((syn->sp).num_lt_pic & 3) << 0x16);
  regs->reg0243_synt_refm1 =
       (anon_struct_4_10_ce746558_for_reg0243_synt_refm1)
       ((uint)regs->reg0243_synt_refm1 & 0xfbffffff |
       ((syn->sp).field_0.CodingSliceFlags >> 0x17 & 1) << 0x1a);
  regs->reg0243_synt_refm1 =
       (anon_struct_4_10_ce746558_for_reg0243_synt_refm1)
       ((uint)regs->reg0243_synt_refm1 & 0xfc0003ff | (uint)(syn->sp).dlt_poc_msb_cycl0 << 10);
  regs->reg0243_synt_refm1 =
       (anon_struct_4_10_ce746558_for_reg0243_synt_refm1)
       ((uint)regs->reg0243_synt_refm1 & 0xdfffffff |
       ((syn->sp).field_0.CodingSliceFlags >> 0x1a & 1) << 0x1d);
  regs->reg0243_synt_refm1 =
       (anon_struct_4_10_ce746558_for_reg0243_synt_refm1)
       ((uint)regs->reg0243_synt_refm1 & 0xbfffffff |
       ((syn->sp).field_0.CodingSliceFlags >> 0x1b & 1) << 0x1e);
  regs->reg0243_synt_refm1 =
       (anon_struct_4_10_ce746558_for_reg0243_synt_refm1)
       ((uint)regs->reg0243_synt_refm1 & 0x7fffffff |
       ((syn->sp).field_0.CodingSliceFlags >> 0x1c) << 0x1f);
  regs->reg0243_synt_refm1 =
       (anon_struct_4_10_ce746558_for_reg0243_synt_refm1)
       ((uint)regs->reg0243_synt_refm1 & 0xfbffffff |
       ((syn->sp).field_0.CodingSliceFlags >> 0x17 & 1) << 0x1a);
  regs->reg0243_synt_refm1 =
       (anon_struct_4_10_ce746558_for_reg0243_synt_refm1)
       ((uint)regs->reg0243_synt_refm1 & 0xfc0003ff | (uint)(syn->sp).dlt_poc_msb_cycl0 << 10);
  regs->reg0243_synt_refm1 =
       (anon_struct_4_10_ce746558_for_reg0243_synt_refm1)
       ((uint)regs->reg0243_synt_refm1 & 0xf7ffffff |
       ((syn->sp).field_0.CodingSliceFlags >> 0x18 & 1) << 0x1b);
  regs->reg0243_synt_refm1 =
       (anon_struct_4_10_ce746558_for_reg0243_synt_refm1)
       ((uint)regs->reg0243_synt_refm1 & 0xfffffc1f | ((syn->sp).num_neg_pic & 0x1f) << 5);
  regs->reg0243_synt_refm1 =
       (anon_struct_4_10_ce746558_for_reg0243_synt_refm1)
       ((uint)regs->reg0243_synt_refm1 & 0xffffffef |
       ((syn->sp).field_0.CodingSliceFlags >> 0x16 & 1) << 4);
  regs->reg0243_synt_refm1 =
       (anon_struct_4_10_ce746558_for_reg0243_synt_refm1)
       ((uint)regs->reg0243_synt_refm1 & 0xfffffff0 | (syn->sp).used_by_s0_flg & 0xf);
  regs->reg0244_synt_refm2 =
       (anon_struct_4_2_92747ea2_for_reg0244_synt_refm2)
       ((uint)regs->reg0244_synt_refm2 & 0xffff0000 | (uint)(syn->sp).dlt_poc_s0_m10);
  regs->reg0244_synt_refm2 =
       (anon_struct_4_2_92747ea2_for_reg0244_synt_refm2)
       ((uint)regs->reg0244_synt_refm2 & 0xffff | (uint)(syn->sp).dlt_poc_s0_m11 << 0x10);
  regs->reg0245_synt_refm3 =
       (anon_struct_4_2_92747ee2_for_reg0245_synt_refm3)
       ((uint)regs->reg0245_synt_refm3 & 0xffff0000 | (uint)(syn->sp).dlt_poc_s0_m12);
  regs->reg0245_synt_refm3 =
       (anon_struct_4_2_92747ee2_for_reg0245_synt_refm3)
       ((uint)regs->reg0245_synt_refm3 & 0xffff | (uint)(syn->sp).dlt_poc_s0_m13 << 0x10);
  regs->reg0246_synt_long_refm0 =
       (anon_struct_4_2_edbc1122_for_reg0246_synt_long_refm0)
       ((uint)regs->reg0246_synt_long_refm0 & 0xffff0000 | (uint)(syn->sp).poc_lsb_lt1);
  regs->reg0247_synt_long_refm1 =
       (anon_struct_4_2_21afb002_for_reg0247_synt_long_refm1)
       ((uint)regs->reg0247_synt_long_refm1 & 0xffff0000 | (uint)(syn->sp).dlt_poc_msb_cycl1);
  regs->reg0246_synt_long_refm0 =
       (anon_struct_4_2_edbc1122_for_reg0246_synt_long_refm0)
       ((uint)regs->reg0246_synt_long_refm0 & 0xffff | (uint)(syn->sp).poc_lsb_lt2 << 0x10);
  regs->reg0243_synt_refm1 =
       (anon_struct_4_10_ce746558_for_reg0243_synt_refm1)
       ((uint)regs->reg0243_synt_refm1 & 0xefffffff |
       ((syn->sp).field_0.CodingSliceFlags >> 0x19 & 1) << 0x1c);
  regs->reg0247_synt_long_refm1 =
       (anon_struct_4_2_21afb002_for_reg0247_synt_long_refm1)
       ((uint)regs->reg0247_synt_long_refm1 & 0xffff | (uint)(syn->sp).dlt_poc_msb_cycl2 << 0x10);
  regs->reg0240_synt_sli1 =
       (anon_struct_4_13_b789f5b8_for_reg0240_synt_sli1)
       ((uint)regs->reg0240_synt_sli1 & 0x87ffffff | ((syn->sp).lst_entry_l0 & 0xf) << 0x1b);
  regs->reg0239_synt_sli0 =
       (anon_struct_4_18_33022604_for_reg0239_synt_sli0)
       ((uint)regs->reg0239_synt_sli0 & 0xffffffdf |
       ((syn->sp).field_0.CodingSliceFlags >> 8 & 1) << 5);
  return;
}

Assistant:

static void vepu540c_h265_set_ref_regs(H265eSyntax_new *syn, hevc_vepu540c_base *regs)
{
    regs->reg0242_synt_refm0.st_ref_pic_flg = syn->sp.st_ref_pic_flg;
    regs->reg0242_synt_refm0.poc_lsb_lt0 = syn->sp.poc_lsb_lt0;
    regs->reg0242_synt_refm0.num_lt_pic = syn->sp.num_lt_pic;

    regs->reg0243_synt_refm1.dlt_poc_msb_prsnt0 = syn->sp.dlt_poc_msb_prsnt0;
    regs->reg0243_synt_refm1.dlt_poc_msb_cycl0 = syn->sp.dlt_poc_msb_cycl0;
    regs->reg0243_synt_refm1.used_by_lt_flg0 = syn->sp.used_by_lt_flg0;
    regs->reg0243_synt_refm1.used_by_lt_flg1 = syn->sp.used_by_lt_flg1;
    regs->reg0243_synt_refm1.used_by_lt_flg2 = syn->sp.used_by_lt_flg2;
    regs->reg0243_synt_refm1.dlt_poc_msb_prsnt0 = syn->sp.dlt_poc_msb_prsnt0;
    regs->reg0243_synt_refm1.dlt_poc_msb_cycl0 = syn->sp.dlt_poc_msb_cycl0;
    regs->reg0243_synt_refm1.dlt_poc_msb_prsnt1 = syn->sp.dlt_poc_msb_prsnt1;
    regs->reg0243_synt_refm1.num_negative_pics = syn->sp.num_neg_pic;
    regs->reg0243_synt_refm1.num_pos_pic = syn->sp.num_pos_pic;

    regs->reg0243_synt_refm1.used_by_s0_flg = syn->sp.used_by_s0_flg;
    regs->reg0244_synt_refm2.dlt_poc_s0_m10 = syn->sp.dlt_poc_s0_m10;
    regs->reg0244_synt_refm2.dlt_poc_s0_m11 = syn->sp.dlt_poc_s0_m11;
    regs->reg0245_synt_refm3.dlt_poc_s0_m12 = syn->sp.dlt_poc_s0_m12;
    regs->reg0245_synt_refm3.dlt_poc_s0_m13 = syn->sp.dlt_poc_s0_m13;

    regs->reg0246_synt_long_refm0.poc_lsb_lt1 = syn->sp.poc_lsb_lt1;
    regs->reg0247_synt_long_refm1.dlt_poc_msb_cycl1 = syn->sp.dlt_poc_msb_cycl1;
    regs->reg0246_synt_long_refm0.poc_lsb_lt2 = syn->sp.poc_lsb_lt2;
    regs->reg0243_synt_refm1.dlt_poc_msb_prsnt2 = syn->sp.dlt_poc_msb_prsnt2;
    regs->reg0247_synt_long_refm1.dlt_poc_msb_cycl2 = syn->sp.dlt_poc_msb_cycl2;
    regs->reg0240_synt_sli1.lst_entry_l0 = syn->sp.lst_entry_l0;
    regs->reg0239_synt_sli0.ref_pic_lst_mdf_l0 = syn->sp.ref_pic_lst_mdf_l0;

    return;
}